

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubDVertex::TopologyHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDVertex *this,
          bool bIncludeSubdivisionProperties)

{
  bool bVar1;
  double dVar2;
  uint local_e4;
  ON_SubDFace *f;
  ON_SubDEdgeSharpness OStack_b8;
  unsigned_short vfi;
  ON_SubDEdgeSharpness s;
  ON_SubDEdge *e;
  ON_SubDEdgePtr eptr;
  undefined1 local_98 [6];
  unsigned_short vei;
  ON_SHA1 sha1;
  bool bIncludeSubdivisionProperties_local;
  ON_SubDVertex *this_local;
  
  sha1.m_sha1_hash.m_digest[0x13] = bIncludeSubdivisionProperties;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_98);
  ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_98,(this->super_ON_SubDComponentBase).m_id);
  if ((sha1.m_sha1_hash.m_digest[0x13] & 1) != 0) {
    ON_SHA1::AccumulateBytes((ON_SHA1 *)local_98,&this->m_vertex_tag,1);
    ON_SHA1::AccumulateDoubleArray((ON_SHA1 *)local_98,3,this->m_P);
  }
  bVar1 = IsCreaseOrCorner(this);
  if (bVar1) {
    sha1.m_sha1_hash.m_digest[0x13] = '\0';
  }
  if (this->m_edges != (ON_SubDEdgePtr *)0x0) {
    ON_SHA1::AccumulateInteger16((ON_SHA1 *)local_98,this->m_edge_count);
    for (eptr.m_ptr._6_2_ = 0; eptr.m_ptr._6_2_ < this->m_edge_count;
        eptr.m_ptr._6_2_ = eptr.m_ptr._6_2_ + 1) {
      e = (ON_SubDEdge *)this->m_edges[eptr.m_ptr._6_2_].m_ptr;
      s.m_edge_sharpness = (float  [2])((ulong)e & 0xfffffffffffffff8);
      if (s.m_edge_sharpness == (float  [2])0x0) {
        ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_98,-1);
      }
      else {
        ON_SHA1::AccumulateInteger32
                  ((ON_SHA1 *)local_98,*(ON__INT32 *)((long)s.m_edge_sharpness + 8));
        ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_98,(uint)e & 1);
        if ((sha1.m_sha1_hash.m_digest[0x13] & 1) != 0) {
          OStack_b8 = ON_SubDEdgePtr::RelativeSharpness((ON_SubDEdgePtr *)&e,true);
          dVar2 = ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff48,0);
          ON_SHA1::AccumulateDouble((ON_SHA1 *)local_98,dVar2);
          dVar2 = ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff48,1);
          ON_SHA1::AccumulateDouble((ON_SHA1 *)local_98,dVar2);
        }
      }
    }
  }
  if (this->m_faces != (ON_SubDFace **)0x0) {
    ON_SHA1::AccumulateInteger16((ON_SHA1 *)local_98,this->m_face_count);
    for (f._6_2_ = 0; f._6_2_ < this->m_face_count; f._6_2_ = f._6_2_ + 1) {
      if (this->m_faces[f._6_2_] == (ON_SubDFace *)0x0) {
        local_e4 = 0xffffffff;
      }
      else {
        local_e4 = (this->m_faces[f._6_2_]->super_ON_SubDComponentBase).m_id;
      }
      ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_98,local_e4);
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_98);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDVertex::TopologyHash(bool bIncludeSubdivisionProperties) const
{
  ON_SHA1 sha1;
  sha1.AccumulateInteger32(m_id);
  if (bIncludeSubdivisionProperties)
  {
    sha1.AccumulateBytes(&this->m_vertex_tag, sizeof(this->m_vertex_tag));
    sha1.AccumulateDoubleArray(3, this->m_P);
  }

  if (this->IsCreaseOrCorner())
    bIncludeSubdivisionProperties = false;

  if (nullptr != this->m_edges)
  {
    sha1.AccumulateInteger16(m_edge_count);
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdgePtr eptr = this->m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
      {
        sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
      }
      else
      {
        sha1.AccumulateInteger32(e->m_id);
        sha1.AccumulateInteger32((ON__UINT32)ON_SUBD_EDGE_DIRECTION(eptr.m_ptr));
        if (bIncludeSubdivisionProperties)
        {
          // passing true here includes the edge tag in the hash.
          const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(true);
          sha1.AccumulateDouble(s[0]);
          sha1.AccumulateDouble(s[1]);
        }
      }
    }
  }

  if (nullptr != this->m_faces)
  {
    sha1.AccumulateInteger16(m_face_count);
    for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
    {
      const ON_SubDFace* f = this->m_faces[vfi];
      sha1.AccumulateInteger32(nullptr == f ? ON_UNSET_UINT_INDEX : f->m_id);
    }
  }

  return sha1.Hash();
}